

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint Var;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar1 & 7) == 3) {
      Saig_ManCexMinDerivePhasePriority_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      uVar1 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28);
      if ((int)uVar1 < 0) {
        __assert_fail("Aig_ObjFanin0(pObj)->iData >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x90,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar1 = (uint)pObj->pFanin0 & 1 ^ uVar1;
    }
    else {
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        return;
      }
      Saig_ManCexMinDerivePhasePriority_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Saig_ManCexMinDerivePhasePriority_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      iVar5 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28);
      if (iVar5 < 0) {
        __assert_fail("Aig_ObjFanin0(pObj)->iData >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x98,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      if (*(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28) < 0) {
        __assert_fail("Aig_ObjFanin1(pObj)->iData >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x99,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar1 = Abc_LitIsCompl(iVar5);
      uVar6 = *(uint *)&pObj->pFanin0 & 1;
      uVar2 = Abc_LitIsCompl(*(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28));
      uVar7 = *(uint *)&pObj->pFanin1 & 1;
      uVar3 = Abc_Lit2Var(*(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28));
      uVar4 = Abc_Lit2Var(*(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28));
      if ((uVar1 == uVar6) || (uVar2 == uVar7)) {
        if (((uVar1 != uVar6) || (Var = uVar3, uVar2 == uVar7)) &&
           (((uVar1 == uVar6 || (Var = uVar4, uVar2 != uVar7)) && (Var = uVar4, uVar4 < uVar3)))) {
          Var = uVar3;
        }
        iVar5 = 0;
      }
      else {
        Var = uVar4;
        if (uVar3 < uVar4) {
          Var = uVar3;
        }
        iVar5 = 1;
      }
      uVar1 = Abc_Var2Lit(Var,iVar5);
    }
    (pObj->field_5).iData = uVar1;
  }
  return;
}

Assistant:

void Saig_ManCexMinDerivePhasePriority_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin0(pObj) );
        assert( Aig_ObjFanin0(pObj)->iData >= 0 );
        pObj->iData = Aig_ObjFanin0(pObj)->iData ^ Aig_ObjFaninC0(pObj);
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        int fPhase0, fPhase1, iPrio0, iPrio1;
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin0(pObj) );
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin1(pObj) );
        assert( Aig_ObjFanin0(pObj)->iData >= 0 );
        assert( Aig_ObjFanin1(pObj)->iData >= 0 );
        fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        iPrio0  = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
        iPrio1  = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
        if ( fPhase0 && fPhase1 ) // both are one
            pObj->iData = Abc_Var2Lit( Abc_MinInt(iPrio0, iPrio1), 1 );
        else if ( !fPhase0 && fPhase1 ) 
            pObj->iData = Abc_Var2Lit( iPrio0, 0 );
        else if ( fPhase0 && !fPhase1 )
            pObj->iData = Abc_Var2Lit( iPrio1, 0 );
        else // both are zero
            pObj->iData = Abc_Var2Lit( Abc_MaxInt(iPrio0, iPrio1), 0 );
    }
}